

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall
ev3dev::ultrasonic_sensor::ultrasonic_sensor(ultrasonic_sensor *this,address_type *address)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *in_RSI;
  iterator in_RDI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000c0;
  address_type *in_stack_000000c8;
  sensor *in_stack_000000d0;
  string *local_108;
  allocator_type *__a;
  string *this_00;
  allocator *this_01;
  string *this_02;
  allocator_type local_d0 [2];
  undefined1 local_ce;
  allocator local_cd [20];
  allocator local_b9;
  string *local_b8;
  string local_b0 [32];
  string local_90 [32];
  string *local_70;
  undefined8 local_68;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  local_ce = 1;
  this_02 = local_b0;
  local_b8 = this_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_02,"lego-ev3-us",&local_b9);
  this_00 = local_90;
  this_01 = local_cd;
  local_b8 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,"lego-nxt-us",this_01);
  local_ce = 0;
  local_70 = local_b0;
  local_68 = 2;
  __a = local_d0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x127e01);
  __l._M_len = (size_type)this_02;
  __l._M_array = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this_01,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        this_00,__a);
  sensor::sensor(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x127e53);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x127e5d);
  local_108 = (string *)&local_70;
  do {
    local_108 = local_108 + -0x20;
    std::__cxx11::string::~string(local_108);
  } while (local_108 != local_b0);
  std::allocator<char>::~allocator((allocator<char> *)local_cd);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

ultrasonic_sensor::ultrasonic_sensor(address_type address)
    : sensor(address, { ev3_ultrasonic, nxt_ultrasonic })
{ }